

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes>::TestBody
          (MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  char *message_00;
  char *in_R9;
  string local_a0;
  AssertHelper local_80;
  Message local_78 [3];
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  TestMessageSet message;
  char encoded [8];
  MessageSetUnknownButValidTypeId<proto2_unittest::TestAllTypes> *this_local;
  
  message.field_0._24_8_ = 0xc04100008021a0b;
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet((TestMessageSet *)&gtest_ar_.message_);
  local_59 = protobuf::MessageLite::ParseFromArray
                       ((MessageLite *)&gtest_ar_.message_,(void *)((long)&message.field_0 + 0x18),8
                       );
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_58,&local_59,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_58,
               (AssertionResult *)"message.ParseFromArray(encoded, sizeof(encoded))","false","true",
               in_R9);
    message_00 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x29f,message_00);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)&gtest_ar_.message_)
  ;
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, MessageSetUnknownButValidTypeId) {
  const char encoded[] = {
      013,     // 1: SGROUP
      032, 2,  // 3:LEN 2
      010, 0,  // 1:0
      020, 4,  // 2:4
      014      // 1: EGROUP
  };
  typename TestFixture::TestMessageSet message;
  EXPECT_TRUE(message.ParseFromArray(encoded, sizeof(encoded)));
}